

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>
::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasNext(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *this)

{
  bool bVar1;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RDI;
  BacktrackData *unaff_retaddr;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_00000038;
  bool local_11;
  
  if ((in_RDI->_normalizationRecording & 1U) != 0) {
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdDone
              ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x4ead96);
    in_RDI->_normalizationRecording = false;
    Lib::BacktrackData::backtrack(unaff_retaddr);
  }
  do {
    bVar1 = hasLeafData(in_RDI);
    local_11 = false;
    if (!bVar1) {
      local_11 = findNextLeaf(in_stack_00000038);
    }
  } while (local_11 != false);
  bVar1 = hasLeafData(in_RDI);
  return bVar1;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }